

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void freeIndex(sqlite3 *db,Index *p)

{
  sqlite3ExprDelete(db,p->pPartIdxWhere);
  sqlite3ExprListDelete(db,p->aColExpr);
  sqlite3DbFree(db,p->zColAff);
  if ((p->field_0x63 & 0x10) != 0) {
    sqlite3DbFree(db,p->azColl);
  }
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

static void freeIndex(sqlite3 *db, Index *p){
#ifndef SQLITE_OMIT_ANALYZE
  sqlite3DeleteIndexSamples(db, p);
#endif
  sqlite3ExprDelete(db, p->pPartIdxWhere);
  sqlite3ExprListDelete(db, p->aColExpr);
  sqlite3DbFree(db, p->zColAff);
  if( p->isResized ) sqlite3DbFree(db, (void *)p->azColl);
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  sqlite3_free(p->aiRowEst);
#endif
  sqlite3DbFree(db, p);
}